

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_bswap32_i32_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg)

{
  TCGv_i32 arg_local;
  TCGv_i32 ret_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  tcg_gen_op2_i32(tcg_ctx,INDEX_op_bswap32_i32,ret,arg);
  return;
}

Assistant:

void tcg_gen_bswap32_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg)
{
    if (TCG_TARGET_HAS_bswap32_i32) {
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_bswap32_i32, ret, arg);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t2 = tcg_const_i32(tcg_ctx, 0x00ff00ff);

                                        /* arg = abcd */
        tcg_gen_shri_i32(tcg_ctx, t0, arg, 8);   /*  t0 = .abc */
        tcg_gen_and_i32(tcg_ctx, t1, arg, t2);   /*  t1 = .b.d */
        tcg_gen_and_i32(tcg_ctx, t0, t0, t2);    /*  t0 = .a.c */
        tcg_gen_shli_i32(tcg_ctx, t1, t1, 8);    /*  t1 = b.d. */
        tcg_gen_or_i32(tcg_ctx, ret, t0, t1);    /* ret = badc */

        tcg_gen_shri_i32(tcg_ctx, t0, ret, 16);  /*  t0 = ..ba */
        tcg_gen_shli_i32(tcg_ctx, t1, ret, 16);  /*  t1 = dc.. */
        tcg_gen_or_i32(tcg_ctx, ret, t0, t1);    /* ret = dcba */

        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
}